

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

Vec_Ptr_t * Gia_ManOrderPios(Aig_Man_t *p,Gia_Man_t *pOrder)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  iVar10 = p->nObjs[2];
  if (iVar10 != pOrder->vCis->nSize) {
    __assert_fail("Aig_ManCiNum(p) == Gia_ManCiNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf3,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = p->nObjs[3];
  if (iVar1 != pOrder->vCos->nSize) {
    __assert_fail("Aig_ManCoNum(p) == Gia_ManCoNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf4,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < (iVar1 + iVar10) - 1U) {
    iVar8 = iVar1 + iVar10;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar6->pArray = ppvVar7;
  if (0 < pOrder->nObjs) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      if (pOrder->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar6;
      }
      uVar2 = *(undefined8 *)(&pOrder->pObjs->field_0x0 + lVar11);
      uVar4 = (uint)uVar2;
      uVar5 = (uint)((ulong)uVar2 >> 0x20);
      if ((~uVar4 & 0x9fffffff) == 0) {
        pVVar9 = p->vCis;
LAB_0070fb21:
        if (pVVar9->nSize <= (int)(uVar5 & 0x1fffffff)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = *(void **)((long)pVVar9->pArray + (ulong)(uVar5 << 3));
        uVar4 = pVVar6->nCap;
        uVar5 = pVVar6->nSize;
        if (uVar5 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar4 * 2;
            if (iVar10 <= (int)uVar4) goto LAB_0070fba5;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar4 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar4 << 4);
            }
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = iVar10;
        }
LAB_0070fba5:
        pVVar6->nSize = uVar5 + 1;
        pVVar6->pArray[(int)uVar5] = pvVar3;
      }
      else if ((~uVar4 & 0x1fffffff) != 0 && (int)uVar4 < 0) {
        pVVar9 = p->vCos;
        goto LAB_0070fb21;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0xc;
    } while (lVar12 < pOrder->nObjs);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Gia_ManOrderPios( Aig_Man_t * p, Gia_Man_t * pOrder )
{
    Vec_Ptr_t * vPios;
    Gia_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p) == Gia_ManCiNum(pOrder) );
    assert( Aig_ManCoNum(p) == Gia_ManCoNum(pOrder) );
    vPios = Vec_PtrAlloc( Aig_ManCiNum(p) + Aig_ManCoNum(p) );
    Gia_ManForEachObj( pOrder, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            Vec_PtrPush( vPios, Aig_ManCi(p, Gia_ObjCioId(pObj)) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_PtrPush( vPios, Aig_ManCo(p, Gia_ObjCioId(pObj)) );
    }
    return vPios;
}